

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

void __thiscall SQTable::Mark(SQTable *this,SQCollectable **chain)

{
  uint uVar1;
  ulong uVar2;
  SQTable *pSVar3;
  long lVar4;
  
  uVar2 = (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  if (-1 < (int)uVar2) {
    (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = uVar2 | 0x80000000;
    pSVar3 = (this->super_SQDelegable)._delegate;
    if (pSVar3 != (SQTable *)0x0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[4])
                (pSVar3,chain);
    }
    uVar1 = this->_numofnodes_minus_one;
    lVar4 = 0;
    do {
      SQSharedState::MarkObject
                ((SQObjectPtr *)((long)&(this->_nodes->key).super_SQObject._type + lVar4),
                 (SQCollectable_conflict **)chain);
      SQSharedState::MarkObject
                ((SQObjectPtr *)((long)&(this->_nodes->val).super_SQObject._type + lVar4),
                 (SQCollectable_conflict **)chain);
      lVar4 = lVar4 + 0x28;
    } while ((ulong)uVar1 * 0x28 + 0x28 != lVar4);
    SQCollectable::RemoveFromChain
              (&((this->super_SQDelegable).super_SQCollectable._sharedstate)->_gc_chain,
               (SQCollectable_conflict *)this);
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQTable::Mark(SQCollectable **chain)
{
    START_MARK()
        if(_delegate) _delegate->Mark(chain);
        SQInteger len = _numofnodes_minus_one;
        for(SQInteger i = 0; i <= len; i++){
            SQSharedState::MarkObject(_nodes[i].key, chain);
            SQSharedState::MarkObject(_nodes[i].val, chain);
        }
    END_MARK()
}